

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editorsmodel.cpp
# Opt level: O2

int __thiscall EditorsModel::emptyRow(EditorsModel *this)

{
  qsizetype qVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  anon_union_24_3_e3d07ef4_for_data local_98;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined1 local_60 [24];
  QArrayDataPointer<char16_t> local_48;
  
  iVar4 = 0;
  do {
    local_98._forAlignment = -NAN;
    local_98._8_8_ = 0;
    local_98._16_8_ = 0;
    iVar2 = (**(code **)(*(long *)this + 0x78))(this,&local_98);
    if (iVar2 <= iVar4) {
      return -1;
    }
    iVar2 = 0;
    do {
      local_98._forAlignment = -NAN;
      local_98._8_8_ = 0;
      local_98._16_8_ = 0;
      iVar3 = (**(code **)(*(long *)this + 0x80))(this,&local_98);
      if (iVar3 <= iVar2) {
        return iVar4;
      }
      local_78 = 0xffffffffffffffff;
      local_70 = 0;
      uStack_68 = 0;
      (**(code **)(*(long *)this + 0x60))(local_60,this,iVar4,iVar2,&local_78);
      (**(code **)(*(long *)this + 0x90))(&local_98,this,local_60,0);
      QVariant::toString();
      qVar1 = local_48.size;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      QVariant::~QVariant((QVariant *)&local_98);
      iVar2 = iVar2 + 1;
    } while (qVar1 == 0);
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

int EditorsModel::emptyRow() const {
    for(int r=0;r<rowCount();r++) {
        bool empty = true;
        for (int c=0;c<columnCount();c++) {
            if (!data(index(r,c)).toString().isEmpty()) {
                empty = false;
                break;
            }
        }
        if (empty) {
            return r;
        }
    }
    return -1;
}